

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O0

DmvVecPtrMap * __thiscall
adios2::format::DataManSerializer::GetFullMetadataMap(DataManSerializer *this)

{
  int iVar1;
  DmvVecPtrMap *in_RDI;
  lock_guard<std::mutex> l;
  ScopedTimer __var2406;
  unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  if (GetFullMetadataMap()::__var406 == '\0') {
    iVar1 = __cxa_guard_acquire(&GetFullMetadataMap()::__var406);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffb0 =
           (unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
            *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                  ,
                                  "DmvVecPtrMap adios2::format::DataManSerializer::GetFullMetadataMap()"
                                  ,0x196);
      GetFullMetadataMap::__var406 = (void *)ps_timer_create_(in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffa8 =
           (unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
            *)GetFullMetadataMap::__var406;
      __cxa_guard_release(&GetFullMetadataMap()::__var406);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,
             (mutex_type *)in_stack_ffffffffffffffa8);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
  ::unordered_map(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xdd33ba);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

DmvVecPtrMap DataManSerializer::GetFullMetadataMap()
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    std::lock_guard<std::mutex> l(m_DataManVarMapMutex);
    return m_DataManVarMap;
}